

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Button.cxx
# Opt level: O0

void __thiscall Fl_Button::setonly(Fl_Button *this)

{
  Fl_Button *this_00;
  uchar uVar1;
  Fl_Group *this_01;
  int iVar2;
  Fl_Widget **ppFVar3;
  Fl_Widget *o;
  Fl_Widget **ppFStack_20;
  int i;
  Fl_Widget **a;
  Fl_Group *g;
  Fl_Button *this_local;
  
  value(this,1);
  this_01 = Fl_Widget::parent(&this->super_Fl_Widget);
  ppFStack_20 = Fl_Group::array(this_01);
  o._4_4_ = Fl_Group::children(this_01);
  while (iVar2 = o._4_4_ + -1, o._4_4_ != 0) {
    ppFVar3 = ppFStack_20 + 1;
    this_00 = (Fl_Button *)*ppFStack_20;
    o._4_4_ = iVar2;
    ppFStack_20 = ppFVar3;
    if ((this_00 != this) && (uVar1 = Fl_Widget::type((Fl_Widget *)this_00), uVar1 == 'f')) {
      value(this_00,0);
    }
  }
  return;
}

Assistant:

void Fl_Button::setonly() { // set this radio button on, turn others off
  value(1);
  Fl_Group* g = parent();
  Fl_Widget*const* a = g->array();
  for (int i = g->children(); i--;) {
    Fl_Widget* o = *a++;
    if (o != this && o->type()==FL_RADIO_BUTTON) ((Fl_Button*)o)->value(0);
  }
}